

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  void *pvVar1;
  ImGuiColumnsSet *pIVar2;
  Pair *pPVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (this->DrawList != &this->DrawListInst) {
    __assert_fail("DrawList == &DrawListInst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x7c2,"ImGuiWindow::~ImGuiWindow()");
  }
  if (this->Name != (char *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(this->Name,GImAllocatorUserData);
  }
  uVar5 = (this->ColumnsStorage).Size;
  if (uVar5 != 0) {
    lVar7 = 0x38;
    uVar6 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar6) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiColumnsSet>::operator[](int) [T = ImGuiColumnsSet]"
                     );
      }
      pvVar1 = *(void **)((long)&((this->ColumnsStorage).Data)->ID + lVar7);
      if (pvVar1 != (void *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        (*GImAllocatorFreeFunc)(pvVar1,GImAllocatorUserData);
        uVar5 = (this->ColumnsStorage).Size;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x40;
    } while (uVar6 != uVar5);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar2 = (this->ColumnsStorage).Data;
  if (pIVar2 != (ImGuiColumnsSet *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
  }
  pPVar3 = (this->StateStorage).Data.Data;
  if (pPVar3 != (Pair *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pPVar3,GImAllocatorUserData);
  }
  puVar4 = (this->IDStack).Data;
  if (puVar4 != (uint *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
  }
  ImGuiDrawContext::~ImGuiDrawContext(&this->DC);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumnsSet();
}